

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int rsa_rsassa_pkcs1_v15_encode
              (mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,size_t dst_len,uchar *dst)

{
  uchar *__dest;
  uchar uVar1;
  uchar uVar2;
  size_t __n;
  size_t sVar3;
  uchar *puVar4;
  byte bVar5;
  int iVar6;
  mbedtls_md_info_t *md_info;
  ulong uVar7;
  char *oid;
  size_t oid_size;
  char *local_58;
  size_t local_50;
  size_t local_48;
  uchar *local_40;
  size_t local_38;
  
  local_50 = 0;
  local_58 = (char *)0x0;
  if (md_alg == MBEDTLS_MD_NONE) {
    local_48 = (size_t)hashlen;
    uVar7 = (ulong)hashlen;
    if (dst_len < uVar7) {
      return -0x4080;
    }
  }
  else {
    md_info = mbedtls_md_info_from_type(md_alg);
    if (md_info == (mbedtls_md_info_t *)0x0) {
      return -0x4080;
    }
    iVar6 = mbedtls_oid_get_oid_by_md(md_alg,&local_58,&local_50);
    if (iVar6 != 0) {
      return -0x4080;
    }
    bVar5 = mbedtls_md_get_size(md_info);
    local_48 = (size_t)bVar5;
    if (0x7f < local_48 + local_50 + 8) {
      return -0x4080;
    }
    uVar7 = local_50 + local_48 + 10;
    if (uVar7 < local_48 + 10 || dst_len < uVar7) {
      return -0x4080;
    }
  }
  __n = local_50;
  uVar7 = dst_len - uVar7;
  iVar6 = -0x4080;
  if (10 < uVar7) {
    dst[0] = '\0';
    dst[1] = '\x01';
    local_40 = dst + 2;
    local_38 = dst_len;
    memset(local_40,0xff,uVar7 - 3);
    puVar4 = local_40;
    dst[uVar7 - 1] = '\0';
    if (md_alg == MBEDTLS_MD_NONE) {
      memcpy(dst + uVar7,hash,local_48);
    }
    else {
      dst[uVar7] = '0';
      uVar1 = (uchar)__n;
      uVar2 = (uchar)local_48;
      dst[uVar7 + 1] = uVar1 + uVar2 + '\b';
      dst[uVar7 + 2] = '0';
      dst[uVar7 + 3] = uVar1 + '\x04';
      dst[uVar7 + 4] = '\x06';
      dst[uVar7 + 5] = uVar1;
      memcpy(local_40 + uVar7 + 4,local_58,__n);
      sVar3 = local_48;
      __dest = puVar4 + __n + 8 + uVar7;
      __dest[-4] = '\x05';
      __dest[-3] = '\0';
      __dest[-2] = '\x04';
      __dest[-1] = uVar2;
      memcpy(__dest,hash,local_48);
      if (puVar4 + sVar3 + __n + uVar7 + 8 != dst + local_38) {
        mbedtls_platform_zeroize(dst,local_38);
        return -0x4080;
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int rsa_rsassa_pkcs1_v15_encode( mbedtls_md_type_t md_alg,
                                        unsigned int hashlen,
                                        const unsigned char *hash,
                                        size_t dst_len,
                                        unsigned char *dst )
{
    size_t oid_size  = 0;
    size_t nb_pad    = dst_len;
    unsigned char *p = dst;
    const char *oid  = NULL;

    /* Are we signing hashed or raw data? */
    if( md_alg != MBEDTLS_MD_NONE )
    {
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        if( mbedtls_oid_get_oid_by_md( md_alg, &oid, &oid_size ) != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );

        /* Double-check that 8 + hashlen + oid_size can be used as a
         * 1-byte ASN.1 length encoding and that there's no overflow. */
        if( 8 + hashlen + oid_size  >= 0x80         ||
            10 + hashlen            <  hashlen      ||
            10 + hashlen + oid_size <  10 + hashlen )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        /*
         * Static bounds check:
         * - Need 10 bytes for five tag-length pairs.
         *   (Insist on 1-byte length encodings to protect against variants of
         *    Bleichenbacher's forgery attack against lax PKCS#1v1.5 verification)
         * - Need hashlen bytes for hash
         * - Need oid_size bytes for hash alg OID.
         */
        if( nb_pad < 10 + hashlen + oid_size )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
        nb_pad -= 10 + hashlen + oid_size;
    }
    else
    {
        if( nb_pad < hashlen )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        nb_pad -= hashlen;
    }

    /* Need space for signature header and padding delimiter (3 bytes),
     * and 8 bytes for the minimal padding */
    if( nb_pad < 3 + 8 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    nb_pad -= 3;

    /* Now nb_pad is the amount of memory to be filled
     * with padding, and at least 8 bytes long. */

    /* Write signature header and padding */
    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset( p, 0xFF, nb_pad );
    p += nb_pad;
    *p++ = 0;

    /* Are we signing raw data? */
    if( md_alg == MBEDTLS_MD_NONE )
    {
        memcpy( p, hash, hashlen );
        return( 0 );
    }

    /* Signing hashed data, add corresponding ASN.1 structure
     *
     * DigestInfo ::= SEQUENCE {
     *   digestAlgorithm DigestAlgorithmIdentifier,
     *   digest Digest }
     * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
     * Digest ::= OCTET STRING
     *
     * Schematic:
     * TAG-SEQ + LEN [ TAG-SEQ + LEN [ TAG-OID  + LEN [ OID  ]
     *                                 TAG-NULL + LEN [ NULL ] ]
     *                 TAG-OCTET + LEN [ HASH ] ]
     */
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char)( 0x08 + oid_size + hashlen );
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char)( 0x04 + oid_size );
    *p++ = MBEDTLS_ASN1_OID;
    *p++ = (unsigned char) oid_size;
    memcpy( p, oid, oid_size );
    p += oid_size;
    *p++ = MBEDTLS_ASN1_NULL;
    *p++ = 0x00;
    *p++ = MBEDTLS_ASN1_OCTET_STRING;
    *p++ = (unsigned char) hashlen;
    memcpy( p, hash, hashlen );
    p += hashlen;

    /* Just a sanity-check, should be automatic
     * after the initial bounds check. */
    if( p != dst + dst_len )
    {
        mbedtls_platform_zeroize( dst, dst_len );
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    }

    return( 0 );
}